

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int MemHashGrowTable(mem_hash_kv_engine *pEngine)

{
  sxu32 sVar1;
  uint uVar2;
  mem_hash_record *pmVar3;
  mem_hash_record *pmVar4;
  uint uVar5;
  mem_hash_record **pSrc;
  uint uVar7;
  sxu32 nByte;
  uint uVar8;
  mem_hash_record **ppmVar6;
  
  sVar1 = pEngine->nBucket;
  nByte = sVar1 << 4;
  pSrc = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,nByte);
  ppmVar6 = pSrc;
  if (pSrc != (mem_hash_record **)0x0) {
    sVar1 = sVar1 * 2;
    SyZero(pSrc,nByte);
    ppmVar6 = &pEngine->pLast;
    uVar2 = pEngine->nRecord;
    uVar5 = sVar1 - 1;
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 4) {
      pmVar3 = *ppmVar6;
      pmVar3->pNextHash = (mem_hash_record *)0x0;
      pmVar3->pPrevHash = (mem_hash_record *)0x0;
      uVar8 = pmVar3->nHash & uVar5;
      pmVar4 = pSrc[uVar8];
      pmVar3->pNextHash = pmVar4;
      if (pmVar4 != (mem_hash_record *)0x0) {
        pmVar4->pPrevHash = pmVar3;
      }
      pSrc[uVar8] = pmVar3;
      if (uVar2 <= uVar7 + 1) break;
      pmVar3 = pmVar3->pNext;
      pmVar3->pNextHash = (mem_hash_record *)0x0;
      pmVar3->pPrevHash = (mem_hash_record *)0x0;
      uVar8 = pmVar3->nHash & uVar5;
      pmVar4 = pSrc[uVar8];
      pmVar3->pNextHash = pmVar4;
      if (pmVar4 != (mem_hash_record *)0x0) {
        pmVar4->pPrevHash = pmVar3;
      }
      pSrc[uVar8] = pmVar3;
      if (uVar2 <= uVar7 + 2) break;
      pmVar3 = pmVar3->pNext;
      pmVar3->pNextHash = (mem_hash_record *)0x0;
      pmVar3->pPrevHash = (mem_hash_record *)0x0;
      uVar8 = pmVar3->nHash & uVar5;
      pmVar4 = pSrc[uVar8];
      pmVar3->pNextHash = pmVar4;
      if (pmVar4 != (mem_hash_record *)0x0) {
        pmVar4->pPrevHash = pmVar3;
      }
      pSrc[uVar8] = pmVar3;
      if (uVar2 <= uVar7 + 3) break;
      pmVar3 = pmVar3->pNext;
      pmVar3->pNextHash = (mem_hash_record *)0x0;
      pmVar3->pPrevHash = (mem_hash_record *)0x0;
      uVar8 = pmVar3->nHash & uVar5;
      pmVar4 = pSrc[uVar8];
      pmVar3->pNextHash = pmVar4;
      if (pmVar4 != (mem_hash_record *)0x0) {
        pmVar4->pPrevHash = pmVar3;
      }
      pSrc[uVar8] = pmVar3;
      ppmVar6 = &pmVar3->pNext;
    }
    uVar5 = SyMemBackendFree(&pEngine->sAlloc,pEngine->apBucket);
    ppmVar6 = (mem_hash_record **)(ulong)uVar5;
    pEngine->apBucket = pSrc;
    pEngine->nBucket = sVar1;
  }
  return (int)ppmVar6;
}

Assistant:

static int MemHashGrowTable(mem_hash_kv_engine *pEngine)
{
	sxu32 nNewSize = pEngine->nBucket << 1;
	mem_hash_record *pEntry;
	mem_hash_record **apNew;
	sxu32 n,iBucket;
	/* Allocate a new larger table */
	apNew = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc, nNewSize * sizeof(mem_hash_record *));
	if( apNew == 0 ){
		/* Not so fatal, simply a performance hit */
		return UNQLITE_OK;
	}
	/* Zero the new table */
	SyZero((void *)apNew, nNewSize * sizeof(mem_hash_record *));
	/* Rehash all entries */
	n = 0;
	pEntry = pEngine->pLast;
	for(;;){
		
		/* Loop one */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop two */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop three */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop four */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;
	}
	/* Release the old table and reflect the change */
	SyMemBackendFree(&pEngine->sAlloc,(void *)pEngine->apBucket);
	pEngine->apBucket = apNew;
	pEngine->nBucket  = nNewSize;
	return UNQLITE_OK;
}